

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplaceRealloc<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,pointer pos)

{
  ulong uVar1;
  SmallVector<int,_10UL> *pSVar2;
  long *plVar3;
  size_type sVar4;
  SmallVector<int,_10UL> *pSVar5;
  Base *ctx;
  Base *pBVar6;
  Base *other;
  long lVar7;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  pBVar6 = (Base *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (Base *)(uVar1 * 2);
  if (pBVar6 < ctx) {
    pBVar6 = ctx;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    pBVar6 = (Base *)0x1ffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  pSVar2 = (SmallVector<int,_10UL> *)operator_new((long)pBVar6 << 6);
  plVar3 = (long *)((long)pSVar2 + lVar7);
  *plVar3 = (long)(plVar3 + 3);
  plVar3[1] = 0;
  plVar3[2] = 10;
  other = &this->data_->super_SmallVectorBase<int>;
  sVar4 = this->len;
  if (other + sVar4 * 2 == &pos->super_SmallVectorBase<int>) {
    pSVar5 = pSVar2;
    if (sVar4 != 0) {
      do {
        ctx = other;
        SmallVector<int,_10UL>::SmallVector(pSVar5,other);
        other = other + 2;
        pSVar5 = pSVar5 + 1;
      } while (other != &pos->super_SmallVectorBase<int>);
    }
  }
  else {
    pSVar5 = pSVar2;
    if (other != &pos->super_SmallVectorBase<int>) {
      do {
        ctx = other;
        SmallVector<int,_10UL>::SmallVector(pSVar5,other);
        other = other + 2;
        pSVar5 = pSVar5 + 1;
      } while (other != &pos->super_SmallVectorBase<int>);
      other = &this->data_->super_SmallVectorBase<int>;
      sVar4 = this->len;
    }
    if (other + sVar4 * 2 != &pos->super_SmallVectorBase<int>) {
      pSVar5 = (SmallVector<int,_10UL> *)(lVar7 + (long)pSVar2);
      do {
        pSVar5 = pSVar5 + 1;
        ctx = &pos->super_SmallVectorBase<int>;
        SmallVector<int,_10UL>::SmallVector(pSVar5,&pos->super_SmallVectorBase<int>);
        pos = (pointer)((long)pos + 0x40);
      } while ((Base *)pos != other + sVar4 * 2);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pBVar6;
  this->data_ = pSVar2;
  return (pointer)((long)pSVar2 + lVar7);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}